

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReorder.c
# Opt level: O0

void Abc_NodeBddReorder(reo_man *p,Abc_Obj_t *pNode)

{
  int iVar1;
  int *pOrder_00;
  DdNode *n;
  int local_34;
  int i;
  int *pOrder;
  DdNode *bFunc;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  reo_man *p_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  pOrder_00 = (int *)malloc((long)iVar1 << 2);
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1) {
    pOrder_00[local_34] = -1;
  }
  n = Extra_Reorder(p,(DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData,pOrder_00)
  ;
  Cudd_Ref(n);
  Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData);
  (pNode->field_5).pData = n;
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1) {
    Abc_ObjFanin(pNode,local_34);
    pOrder_00[local_34] = (pNode->vFanins).pArray[pOrder_00[local_34]];
  }
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1) {
    Abc_ObjFanin(pNode,local_34);
    (pNode->vFanins).pArray[local_34] = pOrder_00[local_34];
  }
  if (pOrder_00 != (int *)0x0) {
    free(pOrder_00);
  }
  return;
}

Assistant:

void Abc_NodeBddReorder( reo_man * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    DdNode * bFunc;
    int * pOrder, i;
    // create the temporary array for the variable order
    pOrder = ABC_ALLOC( int, Abc_ObjFaninNum(pNode) );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        pOrder[i] = -1;
    // reorder the BDD
    bFunc = Extra_Reorder( p, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, pOrder ); Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData );
    pNode->pData = bFunc;
    // update the fanin order
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pOrder[i] = pNode->vFanins.pArray[ pOrder[i] ];
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pNode->vFanins.pArray[i] = pOrder[i];
    ABC_FREE( pOrder );
}